

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void update_nst(int (*array) [8] [5] [5] [5] [5])

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int (*paiVar4) [5];
  int (*paaiVar5) [5] [5];
  int (*paaiVar6) [5] [5];
  int (*paaaiVar7) [5] [5] [5];
  long lVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int (*paaiVar14) [5] [5];
  int *piVar15;
  int (*paaaaiVar16) [5] [5] [5] [5];
  int (*paaaaiVar17) [5] [5] [5] [5];
  int (*paaaaiVar18) [5] [5] [5] [5];
  int (*paaaaiVar19) [5] [5] [5] [5];
  int (*paaaaiVar20) [5] [5] [5] [5];
  int *piVar21;
  int *piVar22;
  long lVar23;
  long lVar24;
  int (*paaaaiVar25) [5] [5] [5] [5];
  int iVar26;
  int (*paiVar27) [5];
  int (*paiVar28) [5];
  int (*paiVar29) [5];
  int iVar30;
  long lVar31;
  int *piVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  int *piVar37;
  int *piVar38;
  int *piVar39;
  int (*paaaaiVar40) [5] [5] [5] [5];
  int *piVar41;
  int (*paaaaiVar42) [5] [5] [5] [5];
  int *piVar43;
  int (*paaaaiVar44) [5] [5] [5] [5];
  int (*paaaaiVar45) [5] [5] [5] [5];
  int iVar46;
  int *piVar47;
  int *piVar48;
  int (*paaiVar49) [5] [5];
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  
  piVar2 = array[1][1][1][1][1] + 1;
  lVar8 = 1;
  do {
    lVar3 = 1;
    piVar9 = piVar2;
    do {
      lVar23 = 1;
      piVar10 = piVar9;
      piVar12 = piVar9;
      do {
        lVar36 = 1;
        piVar11 = piVar10;
        piVar37 = piVar12;
        piVar13 = piVar10;
        do {
          lVar31 = 1;
          piVar15 = piVar11;
          piVar32 = piVar11;
          piVar38 = piVar37;
          piVar22 = piVar13;
          do {
            iVar26 = -10000000;
            lVar24 = 0;
            iVar33 = -10000000;
            iVar46 = -10000000;
            iVar35 = -10000000;
            piVar21 = piVar32;
            piVar39 = piVar38;
            piVar41 = piVar22;
            do {
              iVar30 = piVar15[lVar24];
              if (piVar15[lVar24] < iVar35) {
                iVar30 = iVar35;
              }
              iVar35 = iVar30;
              iVar30 = *piVar21;
              if (*piVar21 < iVar46) {
                iVar30 = iVar46;
              }
              iVar46 = iVar30;
              iVar30 = *piVar41;
              if (*piVar41 < iVar33) {
                iVar30 = iVar33;
              }
              iVar33 = iVar30;
              iVar30 = *piVar39;
              if (*piVar39 < iVar26) {
                iVar30 = iVar26;
              }
              iVar26 = iVar30;
              lVar24 = lVar24 + 1;
              piVar21 = piVar21 + 5;
              piVar41 = piVar41 + 0x19;
              piVar39 = piVar39 + 0x7d;
            } while (lVar24 != 4);
            array[lVar8][lVar3][lVar23][lVar36][lVar31][0] = iVar35;
            array[lVar8][lVar3][lVar23][lVar36][0][lVar31] = iVar46;
            array[lVar8][lVar3][lVar23][0][lVar36][lVar31] = iVar33;
            array[lVar8][lVar3][0][lVar23][lVar36][lVar31] = iVar26;
            lVar31 = lVar31 + 1;
            piVar15 = piVar15 + 5;
            piVar32 = piVar32 + 1;
            piVar22 = piVar22 + 1;
            piVar38 = piVar38 + 1;
          } while (lVar31 != 5);
          lVar36 = lVar36 + 1;
          piVar11 = piVar11 + 0x19;
          piVar13 = piVar13 + 5;
          piVar37 = piVar37 + 5;
        } while (lVar36 != 5);
        lVar23 = lVar23 + 1;
        piVar10 = piVar10 + 0x7d;
        piVar12 = piVar12 + 0x19;
      } while (lVar23 != 5);
      lVar3 = lVar3 + 1;
      piVar9 = piVar9 + 0x271;
    } while (lVar3 != 7);
    lVar8 = lVar8 + 1;
    piVar2 = piVar2 + 5000;
  } while (lVar8 != 7);
  paiVar4 = array[1][1][1][1] + 1;
  piVar2 = array[1][1][0][1][1] + 1;
  piVar9 = array[1][1][1][0][1] + 1;
  piVar10 = array[1][1][1][1][0] + 1;
  lVar8 = 1;
  do {
    lVar3 = 1;
    piVar12 = piVar2;
    piVar11 = piVar9;
    paiVar27 = paiVar4;
    piVar37 = piVar10;
    do {
      lVar23 = 1;
      piVar13 = piVar12;
      piVar15 = piVar11;
      paiVar28 = paiVar27;
      piVar32 = piVar37;
      piVar38 = piVar11;
      do {
        lVar36 = 1;
        piVar22 = piVar13;
        paiVar29 = paiVar28;
        piVar21 = piVar15;
        piVar39 = piVar13;
        piVar41 = piVar32;
        piVar47 = piVar38;
        do {
          iVar26 = -10000000;
          lVar24 = 0;
          lVar31 = 0;
          iVar46 = -10000000;
          iVar35 = -10000000;
          iVar34 = -10000000;
          iVar30 = -10000000;
          iVar33 = -10000000;
          piVar43 = piVar41;
          piVar48 = piVar47;
          do {
            iVar1 = *(int *)((long)*paiVar29 + lVar31);
            if (iVar1 < iVar33) {
              iVar1 = iVar33;
            }
            iVar33 = iVar1;
            iVar1 = *piVar43;
            if (*piVar43 < iVar30) {
              iVar1 = iVar30;
            }
            iVar30 = iVar1;
            iVar1 = *piVar48;
            if (*piVar48 < iVar34) {
              iVar1 = iVar34;
            }
            iVar34 = iVar1;
            iVar1 = *(int *)((long)piVar22 + lVar24);
            if (*(int *)((long)piVar22 + lVar24) < iVar35) {
              iVar1 = iVar35;
            }
            iVar35 = iVar1;
            iVar1 = *(int *)((long)piVar39 + lVar31);
            if (*(int *)((long)piVar39 + lVar31) < iVar46) {
              iVar1 = iVar46;
            }
            iVar46 = iVar1;
            iVar1 = *(int *)((long)piVar21 + lVar24);
            if (*(int *)((long)piVar21 + lVar24) < iVar26) {
              iVar1 = iVar26;
            }
            iVar26 = iVar1;
            lVar31 = lVar31 + 0x14;
            lVar24 = lVar24 + 4;
            piVar43 = piVar43 + 0x19;
            piVar48 = piVar48 + 0x7d;
          } while (lVar31 != 0x50);
          array[lVar8][lVar3][lVar23][lVar36][0][0] = iVar33;
          array[lVar8][lVar3][lVar23][0][0][lVar36] = iVar30;
          array[lVar8][lVar3][0][0][lVar23][lVar36] = iVar34;
          array[lVar8][lVar3][lVar23][0][lVar36][0] = iVar26;
          array[lVar8][lVar3][0][lVar23][0][lVar36] = iVar46;
          array[lVar8][lVar3][0][lVar23][lVar36][0] = iVar35;
          lVar36 = lVar36 + 1;
          paiVar29 = paiVar29 + 5;
          piVar22 = piVar22 + 5;
          piVar39 = piVar39 + 1;
          piVar21 = piVar21 + 5;
          piVar41 = piVar41 + 1;
          piVar47 = piVar47 + 1;
        } while (lVar36 != 5);
        lVar23 = lVar23 + 1;
        paiVar28 = paiVar28 + 0x19;
        piVar13 = piVar13 + 0x19;
        piVar15 = piVar15 + 0x7d;
        piVar32 = piVar32 + 0x7d;
        piVar38 = piVar38 + 5;
      } while (lVar23 != 5);
      lVar3 = lVar3 + 1;
      paiVar27 = paiVar27 + 0x7d;
      piVar12 = piVar12 + 0x271;
      piVar11 = piVar11 + 0x271;
      piVar37 = piVar37 + 0x271;
    } while (lVar3 != 7);
    lVar8 = lVar8 + 1;
    paiVar4 = paiVar4 + 1000;
    piVar2 = piVar2 + 5000;
    piVar9 = piVar9 + 5000;
    piVar10 = piVar10 + 5000;
  } while (lVar8 != 7);
  paaiVar5 = array[1][1][1] + 1;
  paiVar4 = array[1][1][0][1] + 1;
  piVar2 = array[1][1][0][0][1] + 1;
  lVar8 = 1;
  do {
    lVar3 = 1;
    paaiVar14 = paaiVar5;
    piVar9 = piVar2;
    paiVar27 = paiVar4;
    do {
      lVar23 = 1;
      paaiVar6 = paaiVar14;
      piVar10 = piVar9;
      piVar12 = piVar9;
      paiVar28 = paiVar27;
      do {
        iVar33 = -10000000;
        lVar36 = 0;
        iVar26 = -10000000;
        iVar46 = -10000000;
        iVar35 = -10000000;
        piVar11 = piVar12;
        paaiVar49 = paaiVar6;
        do {
          iVar30 = (*paaiVar49)[0][0];
          if (iVar30 < iVar35) {
            iVar30 = iVar35;
          }
          iVar35 = iVar30;
          iVar30 = *(int *)((long)*paiVar28 + lVar36);
          if (iVar30 < iVar46) {
            iVar30 = iVar46;
          }
          iVar46 = iVar30;
          iVar30 = *piVar11;
          if (*piVar11 < iVar26) {
            iVar30 = iVar26;
          }
          iVar26 = iVar30;
          iVar30 = *(int *)((long)piVar10 + lVar36);
          if (*(int *)((long)piVar10 + lVar36) < iVar33) {
            iVar30 = iVar33;
          }
          iVar33 = iVar30;
          paaiVar49 = paaiVar49 + 1;
          lVar36 = lVar36 + 0x14;
          piVar11 = piVar11 + 1;
        } while (lVar36 != 0x50);
        array[lVar8][lVar3][lVar23][0][0][0] = iVar35;
        array[lVar8][lVar3][0][lVar23][0][0] = iVar46;
        array[lVar8][lVar3][0][0][lVar23][0] = iVar26;
        array[lVar8][lVar3][0][0][0][lVar23] = iVar33;
        lVar23 = lVar23 + 1;
        paaiVar6 = paaiVar6 + 5;
        paiVar28 = paiVar28 + 5;
        piVar12 = piVar12 + 5;
        piVar10 = piVar10 + 1;
      } while (lVar23 != 5);
      lVar3 = lVar3 + 1;
      paaiVar14 = paaiVar14 + 0x19;
      paiVar27 = paiVar27 + 0x7d;
      piVar9 = piVar9 + 0x271;
    } while (lVar3 != 7);
    lVar8 = lVar8 + 1;
    paaiVar5 = paaiVar5 + 200;
    paiVar4 = paiVar4 + 1000;
    piVar2 = piVar2 + 5000;
  } while (lVar8 != 7);
  paaaiVar7 = array[1][1] + 4;
  lVar8 = 1;
  do {
    lVar3 = 0;
    do {
      uVar55 = *(uint *)((long)(*paaaiVar7)[0][0] + lVar3);
      uVar56 = *(uint *)((long)paaaiVar7[-1][0][0] + lVar3);
      uVar57 = *(uint *)((long)paaaiVar7[-2][0][0] + lVar3);
      uVar51 = *(uint *)((long)paaaiVar7[-3][0][0] + lVar3);
      uVar50 = -(uint)(-10000000 < (int)uVar51);
      uVar52 = -(uint)(-10000000 < (int)uVar57);
      uVar53 = -(uint)(-10000000 < (int)uVar56);
      uVar54 = -(uint)(-10000000 < (int)uVar55);
      uVar51 = ~uVar50 & 0xff676980 | uVar51 & uVar50;
      uVar57 = ~uVar52 & 0xff676980 | uVar57 & uVar52;
      uVar56 = ~uVar53 & 0xff676980 | uVar56 & uVar53;
      uVar55 = ~uVar54 & 0xff676980 | uVar55 & uVar54;
      uVar50 = -(uint)((int)uVar56 < (int)uVar51);
      uVar52 = -(uint)((int)uVar55 < (int)uVar57);
      uVar56 = ~uVar50 & uVar56 | uVar51 & uVar50;
      uVar57 = ~uVar52 & uVar55 | uVar57 & uVar52;
      uVar55 = -(uint)((int)uVar57 < (int)uVar56);
      *(uint *)((long)(*(int (*) [5] [5] [5] [5])(paaaiVar7 + -4))[0][0][0] + lVar3) =
           ~uVar55 & uVar57 | uVar56 & uVar55;
      lVar3 = lVar3 + 0x9c4;
    } while (lVar3 != 15000);
    lVar8 = lVar8 + 1;
    paaaiVar7 = paaaiVar7 + 0x28;
  } while (lVar8 != 7);
  paaaaiVar16 = array[1] + 1;
  lVar8 = 1;
  paaaaiVar25 = paaaaiVar16;
  do {
    lVar3 = 0;
    paaaaiVar17 = paaaaiVar16;
    paaaaiVar20 = paaaaiVar25;
    do {
      lVar23 = 0;
      paaaaiVar18 = paaaaiVar17;
      paaaaiVar44 = paaaaiVar20;
      do {
        lVar36 = 0;
        paaaaiVar19 = paaaaiVar18;
        paaaaiVar45 = paaaaiVar44;
        do {
          lVar31 = 0;
          paaaaiVar40 = paaaaiVar19;
          paaaaiVar42 = paaaaiVar45;
          do {
            iVar33 = -10000000;
            lVar24 = 0;
            iVar26 = -10000000;
            do {
              iVar35 = *(int *)((long)(*paaaaiVar42)[0][0][0] + lVar24);
              if (iVar35 < iVar26) {
                iVar35 = iVar26;
              }
              iVar26 = iVar35;
              iVar35 = (*paaaaiVar40)[0][0][0][lVar24 * 2];
              if (iVar35 < iVar33) {
                iVar35 = iVar33;
              }
              iVar33 = iVar35;
              lVar24 = lVar24 + 0x9c4;
            } while (lVar24 != 15000);
            array[lVar8][7][lVar3][lVar23][lVar36][lVar31] = iVar26;
            array[7][lVar8][lVar3][lVar23][lVar36][lVar31] = iVar33;
            lVar31 = lVar31 + 1;
            paaaaiVar42 = (int (*) [5] [5] [5] [5])((*paaaaiVar42)[0][0][0] + 1);
            paaaaiVar40 = (int (*) [5] [5] [5] [5])((*paaaaiVar40)[0][0][0] + 1);
          } while (lVar31 != 5);
          lVar36 = lVar36 + 1;
          paaaaiVar45 = (int (*) [5] [5] [5] [5])((*paaaaiVar45)[0][0] + 1);
          paaaaiVar19 = (int (*) [5] [5] [5] [5])((*paaaaiVar19)[0][0] + 1);
        } while (lVar36 != 5);
        lVar23 = lVar23 + 1;
        paaaaiVar44 = (int (*) [5] [5] [5] [5])((*paaaaiVar44)[0] + 1);
        paaaaiVar18 = (int (*) [5] [5] [5] [5])((*paaaaiVar18)[0] + 1);
      } while (lVar23 != 5);
      lVar3 = lVar3 + 1;
      paaaaiVar20 = (int (*) [5] [5] [5] [5])(*paaaaiVar20 + 1);
      paaaaiVar17 = (int (*) [5] [5] [5] [5])(*paaaaiVar17 + 1);
    } while (lVar3 != 5);
    lVar8 = lVar8 + 1;
    paaaaiVar25 = paaaaiVar25 + 8;
    paaaaiVar16 = paaaaiVar16 + 1;
  } while (lVar8 != 7);
  paaaaiVar16 = array[7] + 1;
  lVar8 = 0;
  do {
    lVar3 = 0;
    paaaaiVar25 = paaaaiVar16;
    do {
      lVar23 = 0;
      paaaaiVar17 = paaaaiVar25;
      do {
        lVar36 = 0;
        paaaaiVar20 = paaaaiVar17;
        do {
          iVar26 = -10000000;
          lVar31 = 0;
          do {
            iVar33 = *(int *)((long)(*paaaaiVar20)[0][0][0] + lVar31);
            if (iVar33 < iVar26) {
              iVar33 = iVar26;
            }
            iVar26 = iVar33;
            lVar31 = lVar31 + 0x9c4;
          } while (lVar31 != 15000);
          array[7][7][lVar8][lVar3][lVar23][lVar36] = iVar26;
          lVar36 = lVar36 + 1;
          paaaaiVar20 = (int (*) [5] [5] [5] [5])((*paaaaiVar20)[0][0][0] + 1);
        } while (lVar36 != 5);
        lVar23 = lVar23 + 1;
        paaaaiVar17 = (int (*) [5] [5] [5] [5])((*paaaaiVar17)[0][0] + 1);
      } while (lVar23 != 5);
      lVar3 = lVar3 + 1;
      paaaaiVar25 = (int (*) [5] [5] [5] [5])((*paaaaiVar25)[0] + 1);
    } while (lVar3 != 5);
    lVar8 = lVar8 + 1;
    paaaaiVar16 = (int (*) [5] [5] [5] [5])(*paaaaiVar16 + 1);
  } while (lVar8 != 5);
  return;
}

Assistant:

PRIVATE void
update_nst(int array[NBPAIRS + 1][NBPAIRS + 1][5][5][5][5])
{
  int i, j, k, l, m, n;
  int max, max2, max3, max4, max5, max6;

  /* get maxima for one nonstandard nucleotide */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        for (l = 1; l < 5; l++) {
          for (m = 1; m < 5; m++) {
            max = max2 = max3 = max4 = -INF; /* max of {CGAU} */
            for (n = 1; n < 5; n++) {
              max   = MAX2(max, array[i][j][k][l][m][n]);
              max2  = MAX2(max2, array[i][j][k][l][n][m]);
              max3  = MAX2(max3, array[i][j][k][n][l][m]);
              max4  = MAX2(max4, array[i][j][n][k][l][m]);
            }
            array[i][j][k][l][m][0] = max;
            array[i][j][k][l][0][m] = max2;
            array[i][j][k][0][l][m] = max3;
            array[i][j][0][k][l][m] = max4;
          }
        }
      }
    }
  }
  /* get maxima for two nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        for (l = 1; l < 5; l++) {
          max = max2 = max3 = max4 = max5 = max6 = -INF; /* max of {CGAU} */
          for (m = 1; m < 5; m++) {
            max   = MAX2(max, array[i][j][k][l][m][0]);
            max2  = MAX2(max2, array[i][j][k][m][0][l]);
            max3  = MAX2(max3, array[i][j][m][0][k][l]);
            max4  = MAX2(max4, array[i][j][0][k][l][m]);
            max5  = MAX2(max5, array[i][j][0][k][m][l]);
            max6  = MAX2(max6, array[i][j][k][0][l][m]);
          }
          array[i][j][k][l][0][0] = max;
          array[i][j][k][0][0][l] = max2;
          array[i][j][0][0][k][l] = max3;
          array[i][j][k][0][l][0] = max6;
          array[i][j][0][k][0][l] = max5;
          array[i][j][0][k][l][0] = max4;
        }
      }
    }
  }
  /* get maxima for three nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        max = max2 = max3 = max4 = -INF; /* max of {CGAU} */
        for (l = 1; l < 5; l++) {
          /* should be arbitrary where index l resides in last 3 possible locations */
          max   = MAX2(max, array[i][j][k][l][0][0]);
          max2  = MAX2(max2, array[i][j][0][k][l][0]);
          max3  = MAX2(max3, array[i][j][0][0][k][l]);
          max4  = MAX2(max4, array[i][j][0][0][l][k]);
        }
        array[i][j][k][0][0][0] = max;
        array[i][j][0][k][0][0] = max2;
        array[i][j][0][0][k][0] = max3;
        array[i][j][0][0][0][k] = max4;
      }
    }
  }
  /* get maxima for 4 nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      max = -INF; /* max of {CGAU} */
      for (k = 1; k < 5; k++)
        max = MAX2(max, array[i][j][k][0][0][0]);
      array[i][j][0][0][0][0] = max;
    }
  }

  /*
   * now compute contributions for nonstandard base pairs ...
   * first, 1 nonstandard bp
   */
  for (i = 1; i < NBPAIRS; i++) {
    for (k = 0; k < 5; k++) {
      for (l = 0; l < 5; l++) {
        for (m = 0; m < 5; m++) {
          for (n = 0; n < 5; n++) {
            max = max2 = -INF;
            for (j = 1; j < NBPAIRS; j++) {
              max   = MAX2(max, array[i][j][k][l][m][n]);
              max2  = MAX2(max2, array[j][i][k][l][m][n]);
            }
            array[i][NBPAIRS][k][l][m][n] = max;
            array[NBPAIRS][i][k][l][m][n] = max2;
          }
        }
      }
    }
  }

  /* now 2 nst base pairs */
  for (k = 0; k < 5; k++) {
    for (l = 0; l < 5; l++) {
      for (m = 0; m < 5; m++) {
        for (n = 0; n < 5; n++) {
          max = -INF;
          for (j = 1; j < NBPAIRS; j++)
            max = MAX2(max, array[NBPAIRS][j][k][l][m][n]);
          array[NBPAIRS][NBPAIRS][k][l][m][n] = max;
        }
      }
    }
  }
}